

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::bindTerminals
          (SeparatedSyntaxList<slang::syntax::NameSyntax> *syntaxList,SpecifyTerminalDir dir,
          Scope *parentParent,ASTContext *context)

{
  bool bVar1;
  ParentList *syntax;
  Compilation *__s;
  ASTContext *context_00;
  EVP_PKEY_CTX *src;
  const_iterator cVar2;
  Expression *expr;
  NameSyntax *exprSyntax;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> results;
  iterator_base<const_slang::syntax::NameSyntax_*> *in_stack_fffffffffffffee8;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffef0;
  Expression *in_stack_ffffffffffffff00;
  Scope *in_stack_ffffffffffffff68;
  SpecifyTerminalDir in_stack_ffffffffffffff74;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [3];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_10;
  
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x528113);
  cVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x528130);
  syntax = cVar2.list;
  cVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x528163);
  context_00 = (ASTContext *)cVar2.index;
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                 *)0x5281b7);
    in_stack_ffffffffffffff00 =
         bindTerminal((ExpressionSyntax *)syntax,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68
                      ,context_00);
    if (in_stack_ffffffffffffff00 != (Expression *)0x0) {
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                (in_stack_fffffffffffffef0,(Expression **)in_stack_fffffffffffffee8);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                *)in_stack_fffffffffffffef0);
  }
  __s = ASTContext::getCompilation((ASTContext *)0x528261);
  SmallVectorBase<const_slang::ast::Expression_*>::copy(local_70,(EVP_PKEY_CTX *)__s,src);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff00,
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)__s);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x5282b7);
  return local_10;
}

Assistant:

static std::span<const Expression* const> bindTerminals(
    const SeparatedSyntaxList<NameSyntax>& syntaxList, SpecifyBlockSymbol::SpecifyTerminalDir dir,
    const Scope* parentParent, ASTContext& context) {

    SmallVector<const Expression*> results;
    for (auto exprSyntax : syntaxList) {
        auto expr = bindTerminal(*exprSyntax, dir, parentParent, context);
        if (expr)
            results.push_back(expr);
    }
    return results.copy(context.getCompilation());
}